

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmParseBlanketJSCoverage.cxx
# Opt level: O2

string * __thiscall
cmParseBlanketJSCoverage::JSONParser::getValue
          (string *__return_storage_ptr__,JSONParser *this,string *line,int type)

{
  string *foundFileName;
  
  std::__cxx11::string::rfind((char)line,0x2c);
  std::__cxx11::string::find((char)line,0x3a);
  std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)line);
  return __return_storage_ptr__;
}

Assistant:

std::string getValue(std::string line, int type)
    {
    size_t begIndex;
    size_t endIndex;
    endIndex = line.rfind(',');
    begIndex = line.find_first_of(':');
    if(type == 0)
      {
      //  A unique substring to remove the extra characters
      //  around the files name in the JSON (extra " and ,)
      std::string foundFileName =
          line.substr(begIndex+3,endIndex-(begIndex+4));
      return foundFileName;
      }
    else
      {
      return line.substr(begIndex,line.npos);
      }
    }